

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCut.c
# Opt level: O2

void Abc_NtkCutsSubtractFanunt(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pAVar2;
  uint uVar3;
  int i;
  char *__assertion;
  Abc_Obj_t *pFan0;
  Abc_Obj_t *pFan1;
  
  i = 0;
  uVar3 = 0;
  do {
    if (pNtk->vObjs->nSize <= i) {
      printf("Substracted %d fanouts\n",(ulong)uVar3);
      return;
    }
    pNode = Abc_NtkObj(pNtk,i);
    if (pNode != (Abc_Obj_t *)0x0) {
      iVar1 = Abc_NodeIsMuxType(pNode);
      if (iVar1 != 0) {
        pAVar2 = Abc_NodeRecognizeMux(pNode,&pFan1,&pFan0);
        pFan0._0_1_ = (byte)pFan0 & 0xfe;
        iVar1 = *(int *)(((ulong)pAVar2 & 0xfffffffffffffffe) + 0x2c);
        if (iVar1 < 2) {
          __assertion = "pFanC->vFanouts.nSize > 1";
          uVar3 = 0x41;
LAB_0026ba76:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcCut.c"
                        ,uVar3,"void Abc_NtkCutsSubtractFanunt(Abc_Ntk_t *)");
        }
        *(int *)(((ulong)pAVar2 & 0xfffffffffffffffe) + 0x2c) = iVar1 + -1;
        iVar1 = Abc_NodeIsExorType(pNode);
        if (iVar1 == 0) {
          uVar3 = uVar3 + 1;
        }
        else {
          iVar1 = *(int *)(CONCAT71(pFan0._1_7_,(byte)pFan0) + 0x2c);
          if (iVar1 < 2) {
            __assertion = "pFan0->vFanouts.nSize > 1";
            uVar3 = 0x46;
            goto LAB_0026ba76;
          }
          *(int *)(CONCAT71(pFan0._1_7_,(byte)pFan0) + 0x2c) = iVar1 + -1;
          uVar3 = uVar3 + 2;
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Abc_NtkCutsSubtractFanunt( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pFan0, * pFan1, * pFanC;
    int i, Counter = 0;
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( !Abc_NodeIsMuxType(pObj) )
            continue;
        pFanC = Abc_NodeRecognizeMux( pObj, &pFan1, &pFan0 );
        pFanC = Abc_ObjRegular(pFanC);
        pFan0 = Abc_ObjRegular(pFan0);
        assert( pFanC->vFanouts.nSize > 1 );
        pFanC->vFanouts.nSize--;
        Counter++;
        if ( Abc_NodeIsExorType(pObj) )
        {
            assert( pFan0->vFanouts.nSize > 1 );
            pFan0->vFanouts.nSize--;
            Counter++;
        }
    }
    printf("Substracted %d fanouts\n", Counter );
}